

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::crossover(Chromosome *this,Chromosome *other)

{
  pointer *ppTVar1;
  iterator __first;
  result_type_conflict2 __n;
  size_type sVar2;
  vector<TURNCODE,_std::allocator<TURNCODE>_> *this_00;
  iterator __last;
  vector<TURNCODE,_std::allocator<TURNCODE>_> *this_01;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_110;
  const_iterator local_108;
  TURNCODE *local_100;
  pointer local_f8;
  TURNCODE *local_f0;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_e8;
  const_iterator local_e0;
  TURNCODE *local_d8;
  TURNCODE *local_d0;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_c8;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_c0;
  const_iterator local_b8;
  TURNCODE *local_b0;
  TURNCODE *local_98;
  TURNCODE *local_90;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> local_88;
  const_iterator local_80;
  undefined1 local_78 [8];
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist2;
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist1;
  iterator it2;
  iterator it1;
  vector<TURNCODE,_std::allocator<TURNCODE>_> *list2;
  vector<TURNCODE,_std::allocator<TURNCODE>_> *list1;
  int position;
  uniform_int_distribution<int> crossover;
  Chromosome *other_local;
  Chromosome *this_local;
  
  this_01 = &this->turnList;
  crossover._M_param = (param_type)other;
  sVar2 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::size(this_01);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&stack0xffffffffffffffe0,1,(int)sVar2 + -1);
  __n = std::uniform_int_distribution<int>::operator()
                  ((uniform_int_distribution<int> *)&stack0xffffffffffffffe0,&randomDevice2);
  this_00 = (vector<TURNCODE,_std::allocator<TURNCODE>_> *)((long)crossover._M_param + 8);
  it2 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin(this_01);
  std::
  advance<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,int>
            (&it2,__n);
  nlist1.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin(this_00);
  std::
  advance<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,int>
            ((__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> *)
             &nlist1.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__n);
  ppTVar1 = &nlist2.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::vector
            ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)ppTVar1);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::vector
            ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)local_78);
  local_88._M_current =
       (TURNCODE *)
       std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin
                 ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)ppTVar1);
  __gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>::
  __normal_iterator<TURNCODE*>
            ((__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>> *)
             &local_80,&local_88);
  local_90 = (TURNCODE *)std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin(this_01);
  local_98 = it2._M_current;
  local_b0 = (TURNCODE *)
             std::vector<TURNCODE,std::allocator<TURNCODE>>::
             insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
                       ((vector<TURNCODE,std::allocator<TURNCODE>> *)ppTVar1,local_80,
                        (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                         )local_90,it2._M_current);
  ppTVar1 = &nlist2.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_c0._M_current =
       (TURNCODE *)
       std::vector<TURNCODE,_std::allocator<TURNCODE>_>::end
                 ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)ppTVar1);
  __gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>::
  __normal_iterator<TURNCODE*>
            ((__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>> *)
             &local_b8,&local_c0);
  local_c8._M_current =
       nlist1.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0 = (TURNCODE *)std::vector<TURNCODE,_std::allocator<TURNCODE>_>::end(this_00);
  local_d8 = (TURNCODE *)
             std::vector<TURNCODE,std::allocator<TURNCODE>>::
             insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
                       ((vector<TURNCODE,std::allocator<TURNCODE>> *)ppTVar1,local_b8,local_c8,
                        (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                         )local_d0);
  local_e8._M_current =
       (TURNCODE *)
       std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin
                 ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)local_78);
  __gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>::
  __normal_iterator<TURNCODE*>
            ((__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>> *)
             &local_e0,&local_e8);
  local_f0 = (TURNCODE *)std::vector<TURNCODE,_std::allocator<TURNCODE>_>::begin(this_00);
  local_f8 = nlist1.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_100 = (TURNCODE *)
              std::vector<TURNCODE,std::allocator<TURNCODE>>::
              insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
                        ((vector<TURNCODE,std::allocator<TURNCODE>> *)local_78,local_e0,
                         (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                          )local_f0,
                         (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                          )nlist1.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  local_110._M_current =
       (TURNCODE *)
       std::vector<TURNCODE,_std::allocator<TURNCODE>_>::end
                 ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)local_78);
  __gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>::
  __normal_iterator<TURNCODE*>
            ((__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>> *)
             &local_108,&local_110);
  __first = it2;
  __last = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::end(this_01);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)local_78,local_108,
             (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>)
             __first._M_current,
             (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>)
             __last._M_current);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::operator=
            (this_01,(vector<TURNCODE,_std::allocator<TURNCODE>_> *)
                     &nlist2.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::operator=
            (this_00,(vector<TURNCODE,_std::allocator<TURNCODE>_> *)local_78);
  this->changed = true;
  setId(this);
  *(undefined1 *)((long)crossover._M_param + 0x44) = 1;
  setId((Chromosome *)crossover._M_param);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::~vector
            ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)local_78);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::~vector
            ((vector<TURNCODE,_std::allocator<TURNCODE>_> *)
             &nlist2.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Chromosome::crossover(Chromosome& other) {

    std::uniform_int_distribution<int> crossover(1, turnList.size()-1);
    int position =  crossover(randomDevice2);

    std::vector<TURNCODE>& list1 = this->turnList;
    std::vector<TURNCODE>& list2 = other.turnList;

    auto it1 = list1.begin();
    std::advance(it1, position);
    auto it2 = list2.begin();
    std::advance(it2, position);

    std::vector<TURNCODE> nlist1;
    std::vector<TURNCODE> nlist2;
    nlist1.insert(nlist1.begin(), list1.begin(), it1);
    nlist1.insert(nlist1.end(), it2, list2.end());
    nlist2.insert(nlist2.begin(), list2.begin(), it2);
    nlist2.insert(nlist2.end(), it1, list1.end());

    list1 = std::move(nlist1);
    list2 = std::move(nlist2);


    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
    other.changed = true;
    other.setId();
}